

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::MethodPrototypeSymbol_const*>::
emplaceRealloc<slang::ast::MethodPrototypeSymbol_const*>
          (SmallVectorBase<slang::ast::MethodPrototypeSymbol_const*> *this,pointer pos,
          MethodPrototypeSymbol **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppMVar3;
  MethodPrototypeSymbol **__result;
  MethodPrototypeSymbol **ppMVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  MethodPrototypeSymbol **args_local;
  pointer pos_local;
  SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::max_size
                    ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::calculateGrowth
                       ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this,
                        *(long *)(this + 8) + 1);
  ppMVar3 = SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::begin
                      ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this);
  __result = (MethodPrototypeSymbol **)slang::detail::allocArray(capacity,8);
  ppMVar4 = __result + ((long)pos - (long)ppMVar3 >> 3);
  *ppMVar4 = *args;
  ppMVar3 = SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::end
                      ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this);
  if (pos == ppMVar3) {
    ppMVar3 = SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::begin
                        ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::end
                    ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this);
    std::
    uninitialized_move<slang::ast::MethodPrototypeSymbol_const**,slang::ast::MethodPrototypeSymbol_const**>
              (ppMVar3,(MethodPrototypeSymbol **)ctx,__result);
  }
  else {
    ppMVar3 = SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::begin
                        ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this);
    std::
    uninitialized_move<slang::ast::MethodPrototypeSymbol_const**,slang::ast::MethodPrototypeSymbol_const**>
              (ppMVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::end
                    ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this);
    std::
    uninitialized_move<slang::ast::MethodPrototypeSymbol_const**,slang::ast::MethodPrototypeSymbol_const**>
              (pos,(MethodPrototypeSymbol **)ctx,ppMVar4 + 1);
  }
  SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>::cleanup
            ((SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(MethodPrototypeSymbol ***)this = __result;
  return ppMVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}